

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  ClassNameResolver *this_00;
  undefined4 uVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  reference this_01;
  pointer pMVar5;
  reference this_02;
  pointer pEVar6;
  FileDescriptor *pFVar7;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  *p_Var8;
  pointer pGVar9;
  iterator iVar10;
  string_view local_1a8;
  string_view local_198;
  unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  local_188;
  unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  generator;
  FieldDescriptor *field;
  undefined1 local_168 [8];
  iterator __end4;
  undefined1 local_148 [8];
  iterator __begin4;
  FieldDescriptorSet *__range4;
  iterator it;
  string_view local_110;
  undefined1 local_100 [8];
  string dependency;
  int i_2;
  FieldDescriptorSet extensions;
  int local_ac;
  int local_a8;
  int i_1;
  int i;
  int method_num;
  int bytecode_estimate;
  undefined1 local_90 [8];
  SharedCodeGenerator shared_code_generator;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
            );
  shared_code_generator.options_._72_8_ = "final";
  if (((this->options_).opensource_runtime & 1U) != 0) {
    shared_code_generator.options_._72_8_ = anon_var_dwarf_37cdd0 + 5;
  }
  protobuf::io::Printer::Print<char[6],char_const*>
            (printer,local_28,(char (*) [6])0x1eae11b,
             (char **)&shared_code_generator.options_.strip_nonfunctional_codegen);
  protobuf::io::Printer::Indent(local_18);
  if (((this->options_).opensource_runtime & 1U) != 0) {
    SharedCodeGenerator::SharedCodeGenerator
              ((SharedCodeGenerator *)local_90,this->file_,&this->options_);
    SharedCodeGenerator::GenerateDescriptors((SharedCodeGenerator *)local_90,local_18);
    SharedCodeGenerator::~SharedCodeGenerator((SharedCodeGenerator *)local_90);
  }
  i = 0;
  i_1 = 0;
  for (local_a8 = 0; iVar4 = FileDescriptor::message_type_count(this->file_), local_a8 < iVar4;
      local_a8 = local_a8 + 1) {
    this_01 = std::
              vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,(long)local_a8);
    pMVar5 = std::
             unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
             ::operator->(this_01);
    iVar4 = (*pMVar5->_vptr_MessageGenerator[3])(pMVar5,local_18);
    i = iVar4 + i;
    java::anon_unknown_0::MaybeRestartJavaMethod
              (local_18,&i,&i_1,"_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (local_ac = 0; iVar4 = FileDescriptor::extension_count(this->file_), pPVar2 = local_18,
      local_ac < iVar4; local_ac = local_ac + 1) {
    this_02 = std::
              vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
              ::operator[](&this->extension_generators_,(long)local_ac);
    pEVar6 = std::
             unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator->(this_02);
    iVar4 = (*pEVar6->_vptr_ExtensionGenerator[3])(pEVar6,local_18);
    i = iVar4 + i;
    java::anon_unknown_0::MaybeRestartJavaMethod
              (local_18,&i,&i_1,"_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &extensions.
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
              .
              super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
              .tree_.size_,"descriptor.resolveAllFeaturesImmutable();\n");
  protobuf::io::Printer::Print<>(pPVar2,stack0xffffffffffffff40);
  absl::lts_20250127::
  btree_set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::btree_set((btree_set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&i_2);
  java::anon_unknown_0::CollectExtensions
            (this->file_,
             (btree_set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&i_2);
  if (((this->options_).strip_nonfunctional_codegen & 1U) != 0) {
    absl::lts_20250127::
    erase_if<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable(google::protobuf::io::Printer*)::__0>
              (&i_2);
  }
  for (dependency.field_2._8_4_ = 0; uVar1 = dependency.field_2._8_4_,
      iVar4 = FileDescriptor::dependency_count(this->file_), (int)uVar1 < iVar4;
      dependency.field_2._8_4_ = dependency.field_2._8_4_ + 1) {
    pFVar7 = FileDescriptor::dependency(this->file_,dependency.field_2._8_4_);
    bVar3 = ShouldIncludeDependency(this,pFVar7,true);
    if (bVar3) {
      this_00 = this->name_resolver_;
      pFVar7 = FileDescriptor::dependency(this->file_,dependency.field_2._8_4_);
      ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
                ((string *)local_100,this_00,pFVar7);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_110,"$dependency$.getDescriptor();\n");
      protobuf::io::Printer::Print<char[11],std::__cxx11::string>
                (pPVar2,local_110,(char (*) [11])0x208ae7f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  bVar3 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
          ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                   *)&i_2);
  pPVar2 = local_18;
  if (!bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&it.position_,
               "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
              );
    protobuf::io::Printer::Print<>(pPVar2,stack0xfffffffffffffee0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
    ::btree_iterator((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                      *)&__range4);
    __begin4._8_8_ = &i_2;
    iVar10 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                      *)__begin4._8_8_);
    __end4._8_8_ = iVar10.node_;
    __begin4.node_._0_4_ = iVar10.position_;
    local_148 = (undefined1  [8])__end4._8_8_;
    iVar10 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
             ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                    *)__begin4._8_8_);
    local_168 = (undefined1  [8])iVar10.node_;
    __end4.node_._0_4_ = iVar10.position_;
    while (bVar3 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                   ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                 *)local_148,(iterator *)local_168), pPVar2 = local_18, bVar3) {
      p_Var8 = (__uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                *)absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                               *)local_148);
      generator._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl = *(__uniq_ptr_data<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>,_true,_true>
                       *)&p_Var8->_M_t;
      pGVar9 = std::
               unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               ::operator->(&this->generator_factory_);
      (*pGVar9->_vptr_GeneratorFactory[4])
                (&local_188,pGVar9,
                 generator._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                 ._M_head_impl);
      pEVar6 = std::
               unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
               ::operator->(&local_188);
      iVar4 = (*pEVar6->_vptr_ExtensionGenerator[4])(pEVar6,local_18);
      i = i + iVar4;
      java::anon_unknown_0::MaybeRestartJavaMethod
                (local_18,&i,&i_1,"_clinit_autosplit_dinit_$method_num$(registry);\n",
                 "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                );
      std::
      unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      ::~unique_ptr(&local_188);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
      ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                    *)local_148);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_198,
               "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
              );
    protobuf::io::Printer::Print<>(pPVar2,local_198);
  }
  protobuf::io::Printer::Outdent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"}\n");
  protobuf::io::Printer::Print<>(pPVar2,local_1a8);
  absl::lts_20250127::
  btree_set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~btree_set((btree_set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&i_2);
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Descriptors.FileDescriptor\n"
      "    getDescriptor() {\n"
      "  return descriptor;\n"
      "}\n"
      "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
      "    descriptor;\n"
      "static {\n",
      // TODO: Mark this as final.
      "final", options_.opensource_runtime ? "" : "final");
  printer->Indent();

  if (options_.opensource_runtime) {
    SharedCodeGenerator shared_code_generator(file_, options_);
    shared_code_generator.GenerateDescriptors(printer);
  } else {
  }

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate +=
        message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate +=
        extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  // Feature resolution for Java features uses extension registry
  // which must happen after internalInit() from
  // GenerateNonNestedInitializationCode
  printer->Print("descriptor.resolveAllFeaturesImmutable();\n");

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FieldDescriptorSet extensions;
  CollectExtensions(*file_, &extensions);

  if (options_.strip_nonfunctional_codegen) {
    // Skip feature extensions, which are a visible (but non-functional)
    // deviation between editions and legacy syntax.
    absl::erase_if(extensions, [](const FieldDescriptor* field) {
      return field->containing_type()->full_name() == "google.protobuf.FeatureSet";
    });
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      std::string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print("$dependency$.getDescriptor();\n", "dependency",
                     dependency);
    }
  }

  if (!extensions.empty()) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
        "com.google.protobuf.ExtensionRegistry registry =\n"
        "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (const FieldDescriptor* field : extensions) {
      std::unique_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(field));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_dinit_$method_num$(registry);\n",
          "private static void _clinit_autosplit_dinit_$method_num$(\n"
          "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
        "com.google.protobuf.Descriptors.FileDescriptor\n"
        "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}